

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addJacobianBlock
          (MultipleShootingTranscription *this,size_t initRow,size_t rows,size_t initCol,size_t cols
          )

{
  size_t sVar1;
  size_t toBeAdded;
  size_t sVar2;
  bool bVar3;
  
  for (sVar1 = 0; sVar1 != rows; sVar1 = sVar1 + 1) {
    toBeAdded = initCol;
    sVar2 = cols;
    while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
      addNonZero(this,&this->m_jacobianNZRows,this->m_jacobianNonZeros,sVar1 + initRow);
      addNonZero(this,&this->m_jacobianNZCols,this->m_jacobianNonZeros,toBeAdded);
      this->m_jacobianNonZeros = this->m_jacobianNonZeros + 1;
      toBeAdded = toBeAdded + 1;
    }
  }
  return;
}

Assistant:

void addJacobianBlock(size_t initRow, size_t rows, size_t initCol, size_t cols){
                for (size_t i = 0; i < rows; ++i){
                    for (size_t j = 0; j < cols; ++j){
                        addNonZero(m_jacobianNZRows, m_jacobianNonZeros, initRow + i);
                        addNonZero(m_jacobianNZCols, m_jacobianNonZeros, initCol + j);
                        m_jacobianNonZeros++;
                    }
                }
            }